

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

QListViewItem * __thiscall
QListModeViewBase::indexToListViewItem
          (QListViewItem *__return_storage_ptr__,QListModeViewBase *this,QModelIndex *index)

{
  uint uVar1;
  QListView *pQVar2;
  int *piVar3;
  QWidgetData *pQVar4;
  short sVar5;
  Representation RVar6;
  QSize QVar7;
  int iVar8;
  QListViewPrivate *this_00;
  int iVar9;
  QSize *pQVar10;
  Representation RVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  QStyleOptionViewItem local_100;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar12 = (this->flowPositions).d.size;
  if (((lVar12 == 0) || ((this->segmentPositions).d.size == 0)) || (lVar12 + -1 <= (long)index->r))
  {
    __return_storage_ptr__->x = -1;
    __return_storage_ptr__->y = -1;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->indexHint = -1;
    __return_storage_ptr__->visited = 0xffff;
  }
  else {
    iVar13 = (int)(this->segmentStartRows).d.size;
    iVar14 = iVar13 + -1;
    iVar13 = iVar13 >> 1;
    if (0 < iVar14) {
      iVar9 = 0;
      do {
        iVar8 = iVar13;
        if (index->r < (this->segmentStartRows).d.ptr[iVar13]) {
          iVar14 = iVar13 + -1;
          iVar8 = iVar9;
        }
        iVar13 = iVar14 + iVar8 + 1 >> 1;
        iVar9 = iVar8;
      } while (iVar8 < iVar14);
    }
    memset(&local_100,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_100);
    pQVar2 = (this->super_QCommonListViewBase).qq;
    (**(code **)(*(long *)&(pQVar2->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(pQVar2,&local_100);
    QVar7 = (this->super_QCommonListViewBase).contentsSize;
    local_100.super_QStyleOption.rect.x2.m_i =
         local_100.super_QStyleOption.rect.x1.m_i + QVar7.wd.m_i.m_i + -1;
    local_100.super_QStyleOption.rect.y2.m_i =
         local_100.super_QStyleOption.rect.y1.m_i + QVar7.ht.m_i.m_i + -1;
    this_00 = (this->super_QCommonListViewBase).dd;
    if ((this_00->uniformItemSizes != true) ||
       (QVar7 = this_00->cachedItemSize, ((ulong)QVar7 & 0x8000000080000000) != 0)) {
      QVar7 = QListViewPrivate::itemSize(this_00,&local_100,index);
      this_00 = (this->super_QCommonListViewBase).dd;
    }
    iVar14 = index->r;
    piVar3 = (this->segmentPositions).d.ptr;
    iVar9 = (this->flowPositions).d.ptr[iVar14];
    lVar12 = (long)iVar13;
    iVar13 = piVar3[lVar12];
    RVar6 = QVar7.wd.m_i;
    iVar8 = iVar13;
    RVar11.m_i = RVar6.m_i;
    if (this_00->flow != LeftToRight) {
      iVar8 = iVar9;
      iVar9 = iVar13;
      if (this_00->wrap == true) {
        pQVar10 = (QSize *)(piVar3 + lVar12 + 1);
        if ((this->segmentPositions).d.size <= lVar12 + 1) {
          pQVar10 = &(this->super_QCommonListViewBase).contentsSize;
        }
        RVar11.m_i = (pQVar10->wd).m_i - iVar13;
      }
      else {
        pQVar4 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        RVar11.m_i = ((pQVar4->crect).x2.m_i - (this_00->space * 2 + (pQVar4->crect).x1.m_i)) + 1;
        if (RVar11.m_i <= RVar6.m_i) {
          RVar11.m_i = RVar6.m_i;
        }
      }
    }
    uVar1 = (this_00->itemAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i;
    iVar13 = RVar11.m_i;
    if ((uVar1 & 0x1f) != 0) {
      if (RVar11.m_i < RVar6.m_i) {
        RVar6.m_i = RVar11.m_i;
      }
      if ((uVar1 & 2) != 0) {
        iVar9 = (RVar11.m_i + iVar9) - RVar6.m_i;
      }
      iVar13 = RVar6.m_i;
      if ((uVar1 & 4) != 0) {
        iVar9 = iVar9 + (RVar11.m_i - RVar6.m_i) / 2;
      }
    }
    __return_storage_ptr__->x = iVar9;
    __return_storage_ptr__->y = iVar8;
    sVar5 = (short)iVar13;
    if (0x7ffe < iVar13) {
      sVar5 = 0x7fff;
    }
    __return_storage_ptr__->w = sVar5;
    RVar11.m_i = 0x7fff;
    if (QVar7.ht.m_i.m_i < 0x7fff) {
      RVar11.m_i = QVar7.ht.m_i.m_i;
    }
    __return_storage_ptr__->h = (short)RVar11.m_i;
    __return_storage_ptr__->indexHint = iVar14;
    __return_storage_ptr__->visited = 0xffff;
    QBrush::~QBrush(&local_100.backgroundBrush);
    if (&(local_100.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_100.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_100.icon);
    QLocale::~QLocale(&local_100.locale);
    QFont::~QFont(&local_100.font);
    QStyleOption::~QStyleOption(&local_100.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QListViewItem QListModeViewBase::indexToListViewItem(const QModelIndex &index) const
{
    if (flowPositions.isEmpty()
        || segmentPositions.isEmpty()
        || index.row() >= flowPositions.size() - 1)
        return QListViewItem();

    const int segment = qBinarySearch<int>(segmentStartRows, index.row(),
                                           0, segmentStartRows.size() - 1);


    QStyleOptionViewItem options;
    initViewItemOption(&options);
    options.rect.setSize(contentsSize);
    QSize size = (uniformItemSizes() && cachedItemSize().isValid())
                 ? cachedItemSize() : itemSize(options, index);
    QSize cellSize = size;

    QPoint pos;
    if (flow() == QListView::LeftToRight) {
        pos.setX(flowPositions.at(index.row()));
        pos.setY(segmentPositions.at(segment));
    } else { // TopToBottom
        pos.setY(flowPositions.at(index.row()));
        pos.setX(segmentPositions.at(segment));
        if (isWrapping()) { // make the items as wide as the segment
            int right = (segment + 1 >= segmentPositions.size()
                     ? contentsSize.width()
                     : segmentPositions.at(segment + 1));
            cellSize.setWidth(right - pos.x());
        } else { // make the items as wide as the viewport
            cellSize.setWidth(qMax(size.width(), viewport()->width() - 2 * spacing()));
        }
    }

    if (dd->itemAlignment & Qt::AlignHorizontal_Mask) {
        size.setWidth(qMin(size.width(), cellSize.width()));
        if (dd->itemAlignment & Qt::AlignRight)
            pos.setX(pos.x() + cellSize.width() - size.width());
        if (dd->itemAlignment & Qt::AlignHCenter)
            pos.setX(pos.x() + (cellSize.width() - size.width()) / 2);
    } else {
        size.setWidth(cellSize.width());
    }

    return QListViewItem(QRect(pos, size), index.row());
}